

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_mp3_calculate_seek_points
                    (ma_dr_mp3 *pMP3,ma_uint32 *pSeekPointCount,ma_dr_mp3_seek_point *pSeekPoints)

{
  ma_dr_mp3_seek_point *pmVar1;
  ma_uint64 frameIndex;
  ma_uint64 mVar2;
  ma_bool32 mVar3;
  ma_uint32 mVar4;
  ma_uint32 mVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ma_uint64 totalPCMFrameCount;
  ma_uint64 totalMP3FrameCount;
  ma_dr_mp3__seeking_mp3_frame_info mp3FrameInfo [3];
  float local_bc;
  ulong local_78;
  ulong local_70;
  ma_uint64 local_68;
  ulong uStack_60;
  ma_uint64 local_58;
  ulong uStack_50;
  ma_uint64 local_48;
  ulong uStack_40;
  
  if (pSeekPoints == (ma_dr_mp3_seek_point *)0x0 ||
      (pSeekPointCount == (ma_uint32 *)0x0 || pMP3 == (ma_dr_mp3 *)0x0)) {
    return 0;
  }
  uVar10 = (ulong)*pSeekPointCount;
  if (uVar10 == 0) {
    return 0;
  }
  frameIndex = pMP3->currentPCMFrame;
  mVar3 = ma_dr_mp3_get_mp3_and_pcm_frame_count(pMP3,&local_70,&local_78);
  if (mVar3 == 0) {
    return 0;
  }
  if (local_70 < 3) {
    pSeekPoints->seekPosInBytes = 0;
    pSeekPoints->pcmFrameIndex = 0;
    pSeekPoints->mp3FramesToDiscard = 0;
    pSeekPoints->pcmFramesToDiscard = 0;
    mVar5 = 1;
LAB_0017d7da:
    *pSeekPointCount = mVar5;
    mVar3 = 1;
  }
  else {
    uVar6 = (ulong)((int)local_70 - 1);
    if (uVar10 <= local_70 - 1) {
      uVar6 = uVar10;
    }
    mVar5 = (ma_uint32)uVar6;
    mVar3 = (*pMP3->onSeek)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
    if (mVar3 != 0) {
      uVar10 = 0;
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = 0;
      pMP3->dataSize = 0;
      pMP3->currentPCMFrame = 0;
      pMP3->streamCursor = 0;
      pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
      (pMP3->decoder).header[0] = '\0';
      local_bc = 0.0;
      lVar8 = 8;
      do {
        *(ma_uint64 *)((long)&local_70 + lVar8) = pMP3->streamCursor - pMP3->dataSize;
        *(ulong *)((long)&local_68 + lVar8) = uVar10;
        mVar4 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)0x0);
        if (mVar4 == 0) goto LAB_0017daa3;
        local_bc = local_bc +
                   (float)(int)mVar4 / ((float)pMP3->mp3FrameSampleRate / (float)pMP3->sampleRate);
        uVar9 = (long)local_bc & 0xffffffff;
        local_bc = local_bc - (float)uVar9;
        uVar10 = uVar10 + uVar9;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x38);
      if (mVar5 != 0) {
        uVar11 = 0;
        uVar9 = 0;
        do {
          uVar9 = uVar9 + local_78 / (mVar5 + 1);
          pmVar1 = pSeekPoints + uVar11;
          for (; uVar7 = uStack_50, mVar2 = local_58, uVar10 <= uVar9; uVar10 = uVar10 + uVar7) {
            local_58 = local_48;
            uStack_50 = uStack_40;
            local_68 = mVar2;
            uStack_60 = uVar7;
            local_48 = pMP3->streamCursor - pMP3->dataSize;
            uStack_40 = uVar10;
            mVar4 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)0x0);
            if (mVar4 == 0) {
              pmVar1->seekPosInBytes = local_68;
              pmVar1->pcmFrameIndex = uVar9;
              pmVar1->mp3FramesToDiscard = 2;
              pmVar1->pcmFramesToDiscard = (short)uVar9 - (short)uStack_50;
              goto LAB_0017da2e;
            }
            local_bc = local_bc +
                       (float)(int)mVar4 /
                       ((float)pMP3->mp3FrameSampleRate / (float)pMP3->sampleRate);
            uVar7 = (long)local_bc & 0xffffffff;
            local_bc = local_bc - (float)uVar7;
          }
          pSeekPoints[uVar11].seekPosInBytes = local_68;
          pSeekPoints[uVar11].pcmFrameIndex = uVar9;
          pSeekPoints[uVar11].mp3FramesToDiscard = 2;
          pSeekPoints[uVar11].pcmFramesToDiscard = (short)uVar9 - (short)uStack_50;
LAB_0017da2e:
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar6);
      }
      mVar3 = (*pMP3->onSeek)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
      if (mVar3 != 0) {
        pMP3->pcmFramesConsumedInMP3Frame = 0;
        pMP3->pcmFramesRemainingInMP3Frame = 0;
        pMP3->dataSize = 0;
        pMP3->currentPCMFrame = 0;
        pMP3->streamCursor = 0;
        pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
        (pMP3->decoder).header[0] = '\0';
        mVar3 = ma_dr_mp3_seek_to_pcm_frame(pMP3,frameIndex);
        if (mVar3 == 0) {
          return 0;
        }
        goto LAB_0017d7da;
      }
    }
LAB_0017daa3:
    mVar3 = 0;
  }
  return mVar3;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_calculate_seek_points(ma_dr_mp3* pMP3, ma_uint32* pSeekPointCount, ma_dr_mp3_seek_point* pSeekPoints)
{
    ma_uint32 seekPointCount;
    ma_uint64 currentPCMFrame;
    ma_uint64 totalMP3FrameCount;
    ma_uint64 totalPCMFrameCount;
    if (pMP3 == NULL || pSeekPointCount == NULL || pSeekPoints == NULL) {
        return MA_FALSE;
    }
    seekPointCount = *pSeekPointCount;
    if (seekPointCount == 0) {
        return MA_FALSE;
    }
    currentPCMFrame = pMP3->currentPCMFrame;
    if (!ma_dr_mp3_get_mp3_and_pcm_frame_count(pMP3, &totalMP3FrameCount, &totalPCMFrameCount)) {
        return MA_FALSE;
    }
    if (totalMP3FrameCount < MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1) {
        seekPointCount = 1;
        pSeekPoints[0].seekPosInBytes     = 0;
        pSeekPoints[0].pcmFrameIndex      = 0;
        pSeekPoints[0].mp3FramesToDiscard = 0;
        pSeekPoints[0].pcmFramesToDiscard = 0;
    } else {
        ma_uint64 pcmFramesBetweenSeekPoints;
        ma_dr_mp3__seeking_mp3_frame_info mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1];
        ma_uint64 runningPCMFrameCount = 0;
        float runningPCMFrameCountFractionalPart = 0;
        ma_uint64 nextTargetPCMFrame;
        ma_uint32 iMP3Frame;
        ma_uint32 iSeekPoint;
        if (seekPointCount > totalMP3FrameCount-1) {
            seekPointCount = (ma_uint32)totalMP3FrameCount-1;
        }
        pcmFramesBetweenSeekPoints = totalPCMFrameCount / (seekPointCount+1);
        if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
            return MA_FALSE;
        }
        for (iMP3Frame = 0; iMP3Frame < MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1; ++iMP3Frame) {
            ma_uint32 pcmFramesInCurrentMP3FrameIn;
            MA_DR_MP3_ASSERT(pMP3->streamCursor >= pMP3->dataSize);
            mp3FrameInfo[iMP3Frame].bytePos       = pMP3->streamCursor - pMP3->dataSize;
            mp3FrameInfo[iMP3Frame].pcmFrameIndex = runningPCMFrameCount;
            pcmFramesInCurrentMP3FrameIn = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
            if (pcmFramesInCurrentMP3FrameIn == 0) {
                return MA_FALSE;
            }
            ma_dr_mp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
        }
        nextTargetPCMFrame = 0;
        for (iSeekPoint = 0; iSeekPoint < seekPointCount; ++iSeekPoint) {
            nextTargetPCMFrame += pcmFramesBetweenSeekPoints;
            for (;;) {
                if (nextTargetPCMFrame < runningPCMFrameCount) {
                    pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                    pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                    pSeekPoints[iSeekPoint].mp3FramesToDiscard = MA_DR_MP3_SEEK_LEADING_MP3_FRAMES;
                    pSeekPoints[iSeekPoint].pcmFramesToDiscard = (ma_uint16)(nextTargetPCMFrame - mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                    break;
                } else {
                    size_t i;
                    ma_uint32 pcmFramesInCurrentMP3FrameIn;
                    for (i = 0; i < MA_DR_MP3_COUNTOF(mp3FrameInfo)-1; ++i) {
                        mp3FrameInfo[i] = mp3FrameInfo[i+1];
                    }
                    mp3FrameInfo[MA_DR_MP3_COUNTOF(mp3FrameInfo)-1].bytePos       = pMP3->streamCursor - pMP3->dataSize;
                    mp3FrameInfo[MA_DR_MP3_COUNTOF(mp3FrameInfo)-1].pcmFrameIndex = runningPCMFrameCount;
                    pcmFramesInCurrentMP3FrameIn = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
                    if (pcmFramesInCurrentMP3FrameIn == 0) {
                        pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                        pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                        pSeekPoints[iSeekPoint].mp3FramesToDiscard = MA_DR_MP3_SEEK_LEADING_MP3_FRAMES;
                        pSeekPoints[iSeekPoint].pcmFramesToDiscard = (ma_uint16)(nextTargetPCMFrame - mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                        break;
                    }
                    ma_dr_mp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
                }
            }
        }
        if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
            return MA_FALSE;
        }
        if (!ma_dr_mp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
            return MA_FALSE;
        }
    }
    *pSeekPointCount = seekPointCount;
    return MA_TRUE;
}